

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgr.hpp
# Opt level: O3

sgr * cpp_sgr::operator+(sgr *__return_storage_ptr__,sgr *left,sgr *right)

{
  pointer pcVar1;
  long *plVar2;
  long *plVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_60 [2];
  long local_50 [2];
  long *local_40;
  long local_38;
  long local_30;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  pcVar1 = (left->str)._M_dataplus._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + (left->str)._M_string_length);
  std::__cxx11::string::append((char *)local_60);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_60,(ulong)(right->str)._M_dataplus._M_p);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_30 = *plVar3;
    uStack_28 = (undefined4)plVar2[3];
    uStack_24 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_40 = &local_30;
  }
  else {
    local_30 = *plVar3;
    local_40 = (long *)*plVar2;
  }
  local_38 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->str).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_40,local_38 + (long)local_40);
  if (local_40 != &local_30) {
    operator_delete(local_40,local_30 + 1);
  }
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

sgr operator+(const sgr & left, const sgr & right)
		{
			return sgr(left.str + ";" + right.str);
		}